

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivToChoices_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pOld;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int Num;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  pGVar7 = p->pObjs;
  if ((pObj < pGVar7) || (pGVar7 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar6 = (ulong)(uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar7) >> 2) * -0x55555555] &
          0xfffffff;
  if (uVar6 == 0xfffffff) {
    pGVar7 = (Gia_Obj_t *)0x0;
  }
  else {
    if (p->nObjs <= (int)uVar6) goto LAB_001fe379;
    pGVar7 = pGVar7 + uVar6;
  }
  if (pGVar7 == (Gia_Obj_t *)0x0) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar3 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar3 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x6ce,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)uVar3);
    Gia_ManEquivToChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar6 = *(ulong *)pObj;
    if ((int)pObj[-(uVar6 & 0x1fffffff)].Value < 0) goto LAB_001fe35a;
    uVar3 = (uint)(uVar6 >> 0x20);
    if ((int)pObj[-(ulong)(uVar3 & 0x1fffffff)].Value < 0) goto LAB_001fe35a;
    uVar3 = Gia_ManHashAnd(pNew,(uint)(uVar6 >> 0x1d) & 1 ^ pObj[-(uVar6 & 0x1fffffff)].Value,
                           pObj[-(ulong)(uVar3 & 0x1fffffff)].Value ^ uVar3 >> 0x1d & 1);
    goto LAB_001fe106;
  }
  if ((~*(ulong *)pGVar7 & 0x1fffffff1fffffff) != 0) {
    Gia_ManEquivToChoices_rec(pNew,p,pGVar7);
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar3 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar3 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x6af,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManEquivToChoices_rec(pNew,p,pObj + -(ulong)uVar3);
    Gia_ManEquivToChoices_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar6 = *(ulong *)pObj;
    if ((int)pObj[-(uVar6 & 0x1fffffff)].Value < 0) goto LAB_001fe35a;
    uVar3 = (uint)(uVar6 >> 0x20);
    if ((int)pObj[-(ulong)(uVar3 & 0x1fffffff)].Value < 0) goto LAB_001fe35a;
    uVar3 = Gia_ManHashAnd(pNew,(uint)(uVar6 >> 0x1d) & 1 ^ pObj[-(uVar6 & 0x1fffffff)].Value,
                           pObj[-(ulong)(uVar3 & 0x1fffffff)].Value ^ uVar3 >> 0x1d & 1);
    pObj->Value = uVar3;
    if (((int)uVar3 < 0) || (uVar1 = pGVar7->Value, (int)uVar1 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x133,"int Abc_LitRegular(int)");
    }
    if ((uVar1 ^ uVar3) < 2) {
      if (uVar3 == (((uint)pGVar7 & 1 ^
                    (uint)((ulong)*(undefined8 *)((ulong)pGVar7 & 0xfffffffffffffffe) >> 0x3f)) !=
                    ((uint)pObj & 1 ^
                    (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f)) ^
                   uVar1)) {
        return;
      }
      __assert_fail("(int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) )"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x6b5,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    if (uVar3 < uVar1) {
      return;
    }
    if (uVar3 <= uVar1) {
      __assert_fail("pRepr->Value < pObj->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x6ba,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = pNew->nObjs;
    if ((iVar4 <= (int)(uVar1 >> 1)) || (uVar3 = uVar3 >> 1, iVar4 <= (int)uVar3)) {
LAB_001fe379:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar2 = pNew->pObjs;
    pOld = pGVar2 + (uVar1 >> 1);
    pGVar5 = pGVar2 + uVar3;
    uVar3 = (uint)pNew->pReprs[uVar3] & 0xfffffff;
    if (uVar3 != 0xfffffff) {
      if (iVar4 <= (int)uVar3) goto LAB_001fe379;
      if (pGVar2 != (Gia_Obj_t *)0x0) {
        iVar4 = Gia_ObjId(pNew,pGVar5);
        pGVar5 = Gia_ObjReprObj(pNew,iVar4);
        if (pGVar5 != pOld) {
          return;
        }
        goto LAB_001fe01d;
      }
    }
    iVar4 = Gia_ObjCheckTfi(pNew,pOld,pGVar5);
    if (iVar4 == 0) {
      iVar4 = Gia_ObjId(pNew,pGVar5);
      if (pNew->pNexts[iVar4] != 0) {
        __assert_fail("Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x6c7,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
      iVar4 = Gia_ObjId(pNew,pGVar5);
      Num = Gia_ObjId(pNew,pOld);
      Gia_ObjSetRepr(pNew,iVar4,Num);
      Gia_ManAddNextEntry_rec(pNew,pOld,pGVar5);
    }
  }
LAB_001fe01d:
  if ((int)pGVar7->Value < 0) {
LAB_001fe35a:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  uVar3 = pGVar7->Value ^
          (uint)(((uint)((ulong)*(undefined8 *)((ulong)pGVar7 & 0xfffffffffffffffe) >> 0x3f) ^
                 (uint)pGVar7 & 1) !=
                ((uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f) ^
                (uint)pObj & 1));
LAB_001fe106:
  pObj->Value = uVar3;
  return;
}

Assistant:

void Gia_ManEquivToChoices_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr, * pReprNew, * pObjNew;
    if ( ~pObj->Value )
        return;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        if ( Gia_ObjIsConst0(pRepr) )
        {
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        Gia_ManEquivToChoices_rec( pNew, p, pRepr );
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Abc_LitRegular(pObj->Value) == Abc_LitRegular(pRepr->Value) )
        {
            assert( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) ) );
            return;
        }
        if ( pRepr->Value > pObj->Value ) // should never happen with high resource limit
            return;
        assert( pRepr->Value < pObj->Value );
        pReprNew = Gia_ManObj( pNew, Abc_Lit2Var(pRepr->Value) );
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) )
        {
//            assert( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) == pReprNew );
            if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) != pReprNew )
                return;
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        if ( !Gia_ObjCheckTfi( pNew, pReprNew, pObjNew ) )
        {
            assert( Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0 );
            Gia_ObjSetRepr( pNew, Gia_ObjId(pNew, pObjNew), Gia_ObjId(pNew, pReprNew) );
            Gia_ManAddNextEntry_rec( pNew, pReprNew, pObjNew );
        }
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}